

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifierValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2000>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Result *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar2;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_8d;
  TypeCase local_8c;
  undefined1 local_88 [40];
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_60;
  Result result;
  
  puVar2 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar2 == (ModelDescription *)0x0) {
    puVar2 = Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 2000) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"Model not a text classifier.",(allocator<char> *)local_88);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    this = &result;
    goto LAB_00287742;
  }
  Result::Result(&result);
  local_8c = kStringType;
  __l._M_len = 1;
  __l._M_array = &local_8c;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)&local_60,__l,&local_8d);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_88,(CoreML *)&((ModelDescription *)puVar2)->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_60,in_R8
            );
  Result::operator=(&result,(Result *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&local_60);
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_8c = kStringType;
    __l_00._M_len = 1;
    __l_00._M_array = &local_8c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_60,__l_00,&local_8d);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_88,(CoreML *)&((ModelDescription *)puVar2)->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_60,
               in_R8);
    Result::operator=(&result,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_60);
    bVar1 = Result::good(&result);
    if (!bVar1) goto LAB_00287730;
    if (format->_oneof_case_[0] == 2000) {
      puVar2 = (undefined1 *)(format->Type_).textclassifier_;
    }
    else {
      puVar2 = Specification::CoreMLModels::_TextClassifier_default_instance_;
    }
    if (((TextClassifier *)puVar2)->revision_ == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,"Model revision number not set. Must be >= 1",
                 (allocator<char> *)&local_60);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    }
    else if ((((TextClassifier *)puVar2)->_oneof_case_[0] == 0) ||
            ((((TextClassifier *)puVar2)->_oneof_case_[0] == 200 &&
             ((((((TextClassifier *)puVar2)->ClassLabels_).stringclasslabels_)->vector_).
              super_RepeatedPtrFieldBase.current_size_ < 1)))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,
                 "Model output class label not set. Must have at least one class label",
                 (allocator<char> *)&local_60);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    }
    else {
      if (*(long *)(((ulong)(((TextClassifier *)puVar2)->modelparameterdata_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) != 0) goto LAB_00287730;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,"Model parameter data not set",(allocator<char> *)&local_60);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
LAB_00287730:
    Result::Result(__return_storage_ptr__,&result);
  }
  this = (Result *)&result.m_message;
LAB_00287742:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_textClassifier>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a word tager
        if (!format.has_textclassifier()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a text classifier.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only three outputs with sequence type are allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &textClassifier = format.textclassifier();
        if (textClassifier.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }
        
        int numClassLabels;
        switch (textClassifier.ClassLabels_case()) {
            case Specification::CoreMLModels::TextClassifier::kStringClassLabels:
                numClassLabels = textClassifier.stringclasslabels().vector_size();
                break;
            case Specification::CoreMLModels::TextClassifier::CLASSLABELS_NOT_SET:
                numClassLabels = -1;
                break;
        }
        
        if (numClassLabels <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output class label not set. Must have at least one class label");
        }
        
        if (textClassifier.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }